

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
                *generators,bool is_end)

{
  _func_int **in_RSI;
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  *in_stack_ffffffffffffff80;
  ParamGenerator<(anonymous_namespace)::EncodeParameters> *in_stack_ffffffffffffff88;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  ::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f470a8;
  in_RDI[1]._vptr_ParamIteratorInterface = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
              *)0x4ccb3e);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
              *)0x4ccb57);
  ParamGenerator<(anonymous_namespace)::EncodeParameters>::begin(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<(anonymous_namespace)::EncodeParameters> *)0x4ccb7a);
  ParamIterator<(anonymous_namespace)::EncodeParameters>::~ParamIterator
            ((ParamIterator<(anonymous_namespace)::EncodeParameters> *)0x4ccb86);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x4ccb90);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
              *)0x4ccba8);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<(anonymous_namespace)::EncodeParameters>_>
              *)0x4ccbc1);
  ParamGenerator<(anonymous_namespace)::EncodeParameters>::end(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<(anonymous_namespace)::EncodeParameters> *)0x4ccbe4);
  ParamIterator<(anonymous_namespace)::EncodeParameters>::~ParamIterator
            ((ParamIterator<(anonymous_namespace)::EncodeParameters> *)0x4ccbf0);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x4ccbfa);
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)(in_RDI + 6);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::EncodeParameters>_>
  ::tuple(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  ::shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                *)0x4ccc51);
  ComputeCurrentValue(this_00);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }